

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnection.cpp
# Opt level: O3

QString * __thiscall
QHttpNetworkConnectionPrivate::errorDetail
          (QString *__return_storage_ptr__,QHttpNetworkConnectionPrivate *this,
          NetworkError errorCode,QIODevice *socket,QString *extraDetail)

{
  char16_t *pcVar1;
  QArrayData *pQVar2;
  qsizetype qVar3;
  char *pcVar4;
  char *pcVar5;
  QArrayData *pQVar6;
  long in_FS_OFFSET;
  QAnyStringView QVar7;
  anon_class_1_0_00000001 getPeerName;
  QStringBuilder<QLatin1String,_QString> local_78;
  QArrayData *local_50 [3];
  QArrayData *local_38;
  char16_t *pcStack_30;
  qsizetype local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  if (0x68 < (int)errorCode) {
    if ((int)errorCode < 0x12d) {
      if (errorCode == ProxyAuthenticationRequiredError) {
        pcVar5 = "QHttp";
        pcVar4 = "Proxy requires authentication";
      }
      else {
        if (errorCode != AuthenticationRequiredError) goto switchD_001ff293_caseD_5;
        pcVar5 = "QHttp";
        pcVar4 = "Host requires authentication";
      }
    }
    else if (errorCode == ProtocolUnknownError) {
      pcVar5 = "QHttp";
      pcVar4 = "Unknown protocol specified";
    }
    else {
      if (errorCode != ProtocolFailure) goto switchD_001ff293_caseD_5;
      pcVar5 = "QHttp";
      pcVar4 = "Data corrupted";
    }
    goto LAB_001ff49f;
  }
  if (10 < errorCode - ConnectionRefusedError) {
switchD_001ff293_caseD_5:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      QString::operator=(__return_storage_ptr__,(QString *)extraDetail);
      return __return_storage_ptr__;
    }
    goto LAB_001ff620;
  }
  switch(errorCode) {
  case ConnectionRefusedError:
    pcVar5 = "QHttp";
    pcVar4 = "Connection refused";
    break;
  case RemoteHostClosedError:
    pcVar5 = "QHttp";
    pcVar4 = "Connection closed";
    break;
  case HostNotFoundError:
    local_78.b.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_78.a.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_78.a.m_data = &DAT_aaaaaaaaaaaaaaaa;
    if (socket == (QIODevice *)0x0) {
      local_78.a.m_size = (qsizetype)(this->hostName).d.d;
      local_78.a.m_data = (char *)(this->hostName).d.ptr;
      local_78.b.d.d = (Data *)(this->hostName).d.size;
      if ((QArrayData *)local_78.a.m_size != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)local_78.a.m_size)->ref_)._q_value.super___atomic_base<int>._M_i =
             (((QArrayData *)local_78.a.m_size)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
    else {
      local_38 = (QArrayData *)CONCAT71(local_38._1_7_,0xaa);
      QSocketAbstraction::
      visit<QSocketAbstraction::socketPeerName(QIODevice*)::_lambda(auto:1*)_1_&>
                ((QString *)&local_78,(QSocketAbstraction *)&local_38,
                 (anon_class_1_0_00000001 *)socket,
                 (QIODevice *)
                 ((long)&switchD_001ff293::switchdataD_00268aa8 +
                 (long)(int)(&switchD_001ff293::switchdataD_00268aa8)
                            [errorCode - ConnectionRefusedError]));
    }
    QCoreApplication::translate((char *)local_50,"QHttp","Host %1 not found",0);
    QVar7.m_size = (size_t)local_50;
    QVar7.field_0.m_data = &local_38;
    QString::arg_impl(QVar7,(int)local_78.a.m_data,(QChar)(char16_t)local_78.b.d.d);
    pQVar6 = &((__return_storage_ptr__->d).d)->super_QArrayData;
    pcVar1 = (__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).d = (Data *)local_38;
    (__return_storage_ptr__->d).ptr = pcStack_30;
    qVar3 = (__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = local_28;
    local_38 = pQVar6;
    pcStack_30 = pcVar1;
    local_28 = qVar3;
    if (pQVar6 != (QArrayData *)0x0) {
      LOCK();
      (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar6->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar6,2,0x10);
      }
    }
    if (local_50[0] != (QArrayData *)0x0) {
      LOCK();
      (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_50[0],2,0x10);
      }
    }
    goto LAB_001ff4d7;
  case TimeoutError:
    pcVar5 = "QAbstractSocket";
    pcVar4 = "Socket operation timed out";
    break;
  default:
    goto switchD_001ff293_caseD_5;
  case SslHandshakeFailedError:
    QCoreApplication::translate((char *)&local_78,"QHttp","SSL handshake failed",0);
    pQVar6 = &((__return_storage_ptr__->d).d)->super_QArrayData;
    pcVar1 = (__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).d = (Data *)local_78.a.m_size;
    (__return_storage_ptr__->d).ptr = (char16_t *)local_78.a.m_data;
    pQVar2 = (QArrayData *)(__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = (qsizetype)local_78.b.d.d;
    local_78.a.m_size = (qsizetype)pQVar6;
    local_78.a.m_data = (char *)pcVar1;
    local_78.b.d.d = (Data *)pQVar2;
    if (pQVar6 != (QArrayData *)0x0) {
      LOCK();
      (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar6->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar6,2,0x10);
      }
    }
    if (socket != (QIODevice *)0x0) {
      QIODevice::errorString();
      local_78.b.d.size = local_28;
      local_78.b.d.ptr = pcStack_30;
      local_78.b.d.d = (Data *)local_38;
      local_78.a.m_size = 2;
      local_78.a.m_data = ": ";
      local_38 = (QArrayData *)0x0;
      pcStack_30 = (char16_t *)0x0;
      local_28 = 0;
      operator+=(__return_storage_ptr__,&local_78);
      if (&(local_78.b.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_78.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_78.b.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (local_38 == (QArrayData *)0x0) goto LAB_001ff4f4;
      LOCK();
      (local_38->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_38->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      pQVar6 = local_38;
      if ((local_38->ref_)._q_value.super___atomic_base<int>._M_i != 0) goto LAB_001ff4f4;
      goto LAB_001ff4e5;
    }
    goto LAB_001ff4f4;
  case TooManyRedirectsError:
    pcVar5 = "QHttp";
    pcVar4 = "Too many redirects";
    break;
  case InsecureRedirectError:
    pcVar5 = "QHttp";
    pcVar4 = "Insecure redirect";
  }
LAB_001ff49f:
  QCoreApplication::translate((char *)&local_78,pcVar5,pcVar4,0);
  pQVar6 = &((__return_storage_ptr__->d).d)->super_QArrayData;
  pcVar1 = (__return_storage_ptr__->d).ptr;
  (__return_storage_ptr__->d).d = (Data *)local_78.a.m_size;
  (__return_storage_ptr__->d).ptr = (char16_t *)local_78.a.m_data;
  pQVar2 = (QArrayData *)(__return_storage_ptr__->d).size;
  (__return_storage_ptr__->d).size = (qsizetype)local_78.b.d.d;
  local_78.a.m_size = (qsizetype)pQVar6;
  local_78.a.m_data = (char *)pcVar1;
  local_78.b.d.d = (Data *)pQVar2;
LAB_001ff4d7:
  if ((QArrayData *)local_78.a.m_size != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_78.a.m_size)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_78.a.m_size)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    pQVar6 = (QArrayData *)local_78.a.m_size;
    if ((((QBasicAtomicInt *)local_78.a.m_size)->_q_value).super___atomic_base<int>._M_i == 0) {
LAB_001ff4e5:
      QArrayData::deallocate(pQVar6,2,0x10);
    }
  }
LAB_001ff4f4:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
LAB_001ff620:
  __stack_chk_fail();
}

Assistant:

QString QHttpNetworkConnectionPrivate::errorDetail(QNetworkReply::NetworkError errorCode, QIODevice *socket, const QString &extraDetail)
{
    QString errorString;
    switch (errorCode) {
    case QNetworkReply::HostNotFoundError: {
        const QString peerName = socket ? QSocketAbstraction::socketPeerName(socket) : hostName;
        errorString = QCoreApplication::translate("QHttp", "Host %1 not found").arg(peerName);
        break;
    }
    case QNetworkReply::ConnectionRefusedError:
        errorString = QCoreApplication::translate("QHttp", "Connection refused");
        break;
    case QNetworkReply::RemoteHostClosedError:
        errorString = QCoreApplication::translate("QHttp", "Connection closed");
        break;
    case QNetworkReply::TimeoutError:
        errorString = QCoreApplication::translate("QAbstractSocket", "Socket operation timed out");
        break;
    case QNetworkReply::ProxyAuthenticationRequiredError:
        errorString = QCoreApplication::translate("QHttp", "Proxy requires authentication");
        break;
    case QNetworkReply::AuthenticationRequiredError:
        errorString = QCoreApplication::translate("QHttp", "Host requires authentication");
        break;
    case QNetworkReply::ProtocolFailure:
        errorString = QCoreApplication::translate("QHttp", "Data corrupted");
        break;
    case QNetworkReply::ProtocolUnknownError:
        errorString = QCoreApplication::translate("QHttp", "Unknown protocol specified");
        break;
    case QNetworkReply::SslHandshakeFailedError:
        errorString = QCoreApplication::translate("QHttp", "SSL handshake failed");
        if (socket)
            errorString += ": "_L1 + socket->errorString();
        break;
    case QNetworkReply::TooManyRedirectsError:
        errorString = QCoreApplication::translate("QHttp", "Too many redirects");
        break;
    case QNetworkReply::InsecureRedirectError:
        errorString = QCoreApplication::translate("QHttp", "Insecure redirect");
        break;
    default:
        // all other errors are treated as QNetworkReply::UnknownNetworkError
        errorString = extraDetail;
        break;
    }
    return errorString;
}